

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_group.h
# Opt level: O0

void __thiscall features::truncate_to(features *this,features_value_iterator *pos)

{
  float *pfVar1;
  unsigned_long *puVar2;
  float **ppfVar3;
  long lVar4;
  unsigned_long **ppuVar5;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  **ppsVar6;
  long *in_RSI;
  v_array<float> *in_RDI;
  ssize_t i;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar7;
  features *in_stack_ffffffffffffffc0;
  
  lVar4 = *in_RSI;
  ppfVar3 = v_array<float>::begin(in_RDI);
  lVar4 = lVar4 - (long)*ppfVar3 >> 2;
  pfVar1 = (float *)*in_RSI;
  ppfVar3 = v_array<float>::end(in_RDI);
  *ppfVar3 = pfVar1;
  ppuVar5 = v_array<unsigned_long>::end((v_array<unsigned_long> *)(in_RDI + 1));
  puVar2 = *ppuVar5;
  ppuVar5 = v_array<unsigned_long>::begin((v_array<unsigned_long> *)(in_RDI + 1));
  if (puVar2 != *ppuVar5) {
    ppuVar5 = v_array<unsigned_long>::begin((v_array<unsigned_long> *)(in_RDI + 1));
    in_stack_ffffffffffffffc0 = (features *)(*ppuVar5 + lVar4);
    ppuVar5 = v_array<unsigned_long>::end((v_array<unsigned_long> *)(in_RDI + 1));
    *ppuVar5 = (unsigned_long *)in_stack_ffffffffffffffc0;
  }
  ppsVar6 = v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::begin((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)(in_RDI + 2));
  psVar7 = *ppsVar6;
  ppsVar6 = v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::end((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(in_RDI + 2));
  if (psVar7 != *ppsVar6) {
    free_space_names(in_stack_ffffffffffffffc0,(size_t)psVar7);
    ppsVar6 = v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::begin((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)(in_RDI + 2));
    psVar7 = *ppsVar6;
    ppsVar6 = v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)(in_RDI + 2));
    *ppsVar6 = psVar7 + lVar4;
  }
  return;
}

Assistant:

void truncate_to(const features_value_iterator& pos)
  {
    ssize_t i = pos._begin - values.begin();
    values.end() = pos._begin;
    if (indicies.end() != indicies.begin())
      indicies.end() = indicies.begin() + i;
    if (space_names.begin() != space_names.end())
    {
      free_space_names(i);
      space_names.end() = space_names.begin() + i;
    }
  }